

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::SetTemplateGlobalValue
          (TemplateDictionary *this,TemplateString variable,TemplateString value)

{
  if (this->template_global_dict_owner_ != (TemplateDictionary *)0x0) {
    LazyCreateTemplateGlobalDict(this);
    SetValue(this->template_global_dict_owner_->template_global_dict_,variable,value);
    return;
  }
  __assert_fail("template_global_dict_owner_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x1f8,
                "void ctemplate::TemplateDictionary::SetTemplateGlobalValue(const TemplateString, const TemplateString)"
               );
}

Assistant:

void TemplateDictionary::SetTemplateGlobalValue(const TemplateString variable,
                                                const TemplateString value) {
  assert(template_global_dict_owner_ != NULL);
  LazyCreateTemplateGlobalDict();
  template_global_dict_owner_->template_global_dict_->SetValue(variable, value);
}